

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastV8R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  RepeatedField<bool> *this;
  ulong uVar7;
  uint *puVar8;
  char *pcVar9;
  TcFieldData TVar10;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined7 uVar12;
  undefined8 extraout_RDX_00;
  ushort *puVar13;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  pcVar9 = (char *)((ulong)data.field_0 >> 0x30);
  this = RefAt<google::protobuf::RepeatedField<bool>>(msg,(size_t)pcVar9);
  cVar1 = *ptr;
  uVar11 = extraout_RDX;
  while( true ) {
    puVar13 = (ushort *)((long)ptr + 2);
    bVar2 = *(byte *)((long)ptr + 1);
    uVar12 = (undefined7)((ulong)uVar11 >> 8);
    uVar6 = (uint)CONCAT71(uVar12,bVar2);
    if (1 < bVar2) {
      bVar4 = 1;
      if ((char)bVar2 < '\0') {
        bVar3 = (byte)*(ushort *)((long)ptr + 2);
        TVar10.field_0._1_7_ = (undefined7)((ulong)puVar13 >> 8);
        bVar4 = bVar2 & 0x7f | bVar3;
        if ((char)bVar3 < '\0') {
          bVar5 = bVar2 & 0x7f | bVar3 & 0x7f;
          bVar3 = *(byte *)((long)ptr + 3);
          bVar4 = bVar5 | bVar3;
          if ((char)bVar3 < '\0') {
            bVar5 = bVar5 | bVar3 & 0x7f;
            bVar3 = (byte)*(ushort *)((long)ptr + 4);
            bVar4 = bVar5 | bVar3;
            if ((char)bVar3 < '\0') {
              bVar5 = bVar5 | bVar3 & 0x7f;
              bVar3 = *(byte *)((long)ptr + 5);
              bVar4 = bVar5 | bVar3;
              if ((char)bVar3 < '\0') {
                bVar5 = bVar5 | bVar3 & 0x7f;
                bVar3 = (byte)*(ushort *)((long)ptr + 6);
                bVar4 = bVar5 | bVar3;
                if ((char)bVar3 < '\0') {
                  bVar5 = bVar5 | bVar3 & 0x7f;
                  bVar3 = *(byte *)((long)ptr + 7);
                  bVar4 = bVar5 | bVar3;
                  if ((char)bVar3 < '\0') {
                    bVar5 = bVar5 | bVar3 & 0x7f;
                    bVar3 = (byte)*(ushort *)((long)ptr + 8);
                    bVar4 = bVar5 | bVar3;
                    if ((char)bVar3 < '\0') {
                      bVar5 = bVar5 | bVar3 & 0x7f;
                      bVar3 = *(byte *)((long)ptr + 9);
                      bVar4 = bVar5 | bVar3;
                      if ((char)bVar3 < '\0') {
                        bVar4 = (byte)*(ushort *)((long)ptr + 10);
                        TVar10.field_0.data._0_1_ = bVar4;
                        if ((char)bVar4 < '\0') {
                          pcVar9 = Error(msg,pcVar9,
                                         (ParseContext *)
                                         (CONCAT71(uVar12,bVar2) & 0xffffffffffffff7f),TVar10,table,
                                         hasbits);
                          return pcVar9;
                        }
                        puVar13 = (ushort *)((long)ptr + 0xb);
                        bVar4 = bVar5 | bVar3 & 0x7f | bVar4 & 0x81;
                      }
                      else {
                        puVar13 = (ushort *)((long)ptr + 10);
                      }
                    }
                    else {
                      puVar13 = (ushort *)((long)ptr + 9);
                    }
                  }
                  else {
                    puVar13 = (ushort *)((long)ptr + 8);
                  }
                }
                else {
                  puVar13 = (ushort *)((long)ptr + 7);
                }
              }
              else {
                puVar13 = (ushort *)((long)ptr + 6);
              }
            }
            else {
              puVar13 = (ushort *)((long)ptr + 5);
            }
          }
          else {
            puVar13 = (ushort *)((long)ptr + 4);
          }
        }
        else {
          puVar13 = (ushort *)((long)ptr + 3);
        }
      }
      uVar6 = (uint)(bVar4 != 0);
    }
    pcVar9 = (char *)(ulong)(uVar6 & 1);
    RepeatedField<bool>::Add(this,SUB41(uVar6 & 1,0));
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar13) break;
    uVar11 = extraout_RDX_00;
    ptr = (char *)puVar13;
    if ((char)*puVar13 != cVar1) {
      uVar6 = (uint)table->fast_idx_mask & (uint)*puVar13;
      if ((uVar6 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar7 = (ulong)(uVar6 & 0xfffffff8);
      pcVar9 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                                 (msg,puVar13,ctx,
                                  (ulong)*puVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2),
                                  table,hasbits);
      return pcVar9;
    }
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar8 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar8 = *puVar8 | (uint)hasbits;
  }
  return (char *)puVar13;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<bool, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}